

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O2

int stbi__hdr_test_core(stbi__context *s,char *signature)

{
  char cVar1;
  byte bVar2;
  
  do {
    if (*signature == '\0') {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 1;
    }
    bVar2 = stbi__get8(s);
    cVar1 = *signature;
    signature = signature + 1;
  } while ((uint)bVar2 == (int)cVar1);
  return 0;
}

Assistant:

static int stbi__hdr_test_core(stbi__context *s, const char *signature)
{
   int i;
   for (i=0; signature[i]; ++i)
      if (stbi__get8(s) != signature[i])
          return 0;
   stbi__rewind(s);
   return 1;
}